

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.h
# Opt level: O3

string * __thiscall
cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
          (string *__return_storage_ptr__,FrameworkDescriptor *this)

{
  pointer pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_70 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  size_type local_20;
  pointer local_18;
  undefined8 local_10;
  
  local_20 = (this->Suffix)._M_string_length;
  if (local_20 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->Name)._M_string_length);
  }
  else {
    local_50.first._M_str = (this->Name)._M_dataplus._M_p;
    local_50.first._M_len = (this->Name)._M_string_length;
    local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_30 = local_70;
    local_70[0] = 0x2c;
    local_38 = 1;
    local_28 = 0;
    local_18 = (this->Suffix)._M_dataplus._M_p;
    local_10 = 0;
    views._M_len = 3;
    views._M_array = &local_50;
    cmCatViews(__return_storage_ptr__,views);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetLinkName() const
    {
      return this->Suffix.empty() ? this->Name
                                  : cmStrCat(this->Name, ',', this->Suffix);
    }